

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O3

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  key_type **pppcVar1;
  ulong uVar2;
  uint __val;
  PyTypeObject *pPVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  detail *this;
  char *pcVar8;
  long *plVar9;
  long *plVar10;
  undefined8 *puVar11;
  PyTypeObject *pPVar12;
  long *plVar13;
  ulong *puVar14;
  ulong uVar15;
  PyObject *pPVar16;
  handle *handle;
  handle *handle_00;
  string *in_RDI;
  undefined8 uVar17;
  uint __len;
  size_type __dnew;
  string __str;
  error_scope scope;
  handle local_1a8;
  size_type local_1a0;
  PyObject local_198;
  string local_188;
  accessor<pybind11::detail::accessor_policies::str_attr> local_168;
  long *local_148;
  undefined8 local_140;
  long local_138;
  undefined8 uStack_130;
  ulong *local_128;
  long local_120;
  ulong local_118;
  long lStack_110;
  ulong *local_108;
  handle *local_100;
  ulong local_f8;
  long lStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8 [2];
  PyObject *local_c8;
  size_type local_c0;
  PyObject local_b8;
  error_scope local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string *local_88;
  PyObject *local_80;
  size_type local_78;
  PyObject local_70;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long local_40;
  long local_38;
  
  lVar7 = PyErr_Occurred();
  if (lVar7 == 0) {
    PyErr_SetString(_PyExc_RuntimeError,"Unknown internal error occurred");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    local_188._M_dataplus._M_p = (pointer)0x1f;
    pcVar8 = (char *)std::__cxx11::string::_M_create((ulong *)in_RDI,(ulong)&local_188);
    (in_RDI->_M_dataplus)._M_p = pcVar8;
    (in_RDI->field_2)._M_allocated_capacity = (size_type)local_188._M_dataplus._M_p;
    builtin_strncpy(pcVar8,"Unknown internal error occurred",0x1f);
    in_RDI->_M_string_length = (size_type)local_188._M_dataplus._M_p;
    local_188._M_dataplus._M_p[(long)(in_RDI->_M_dataplus)._M_p] = '\0';
  }
  else {
    PyErr_Fetch(&local_a8,&local_a8.value,&local_a8.trace);
    local_90 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)local_90;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
    local_88 = in_RDI;
    if (local_a8.type != (PyObject *)0x0) {
      local_168.obj.m_ptr = local_a8.type;
      local_168.key = "__name__";
      local_168.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      this = (detail *)
             accessor<pybind11::detail::accessor_policies::str_attr>::get_cache(&local_168);
      load_type<std::__cxx11::string>
                ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,this,handle);
      local_1a8.m_ptr = (PyObject *)local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == &local_188.field_2) {
        local_198.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
        local_1a8.m_ptr = &local_198;
      }
      local_198.ob_refcnt = local_188.field_2._M_allocated_capacity;
      local_1a0 = local_188._M_string_length;
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
      if (local_1a8.m_ptr != &local_198) {
        operator_delete(local_1a8.m_ptr,local_198.ob_refcnt + 1);
      }
      object::~object(&local_168.cache);
      std::__cxx11::string::append((char *)in_RDI);
    }
    if (local_a8.value != (PyObject *)0x0) {
      str::str((str *)&local_1a8,(handle)local_a8.value);
      str::operator_cast_to_string(&local_188,(str *)&local_1a8);
      std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      object::~object((object *)&local_1a8);
    }
    PyErr_NormalizeException(&local_a8,&local_a8.value,&local_a8.trace);
    if ((local_a8.trace != (PyObject *)0x0) &&
       (PyException_SetTraceback(local_a8.value), local_a8.trace != (PyObject *)0x0)) {
      do {
        pPVar16 = local_a8.trace;
        local_a8.trace = (PyObject *)pPVar16[1].ob_refcnt;
      } while (local_a8.trace != (PyObject *)0x0);
      pPVar12 = pPVar16[1].ob_type;
      if (pPVar12 != (PyTypeObject *)0x0) {
        (pPVar12->ob_base).ob_base.ob_refcnt = (pPVar12->ob_base).ob_base.ob_refcnt + 1;
      }
      std::__cxx11::string::append((char *)in_RDI);
      while (pPVar3 = pPVar12, pPVar3 != (PyTypeObject *)0x0) {
        plVar9 = (long *)PyFrame_GetCode(pPVar3);
        uVar5 = PyFrame_GetLineNumber(pPVar3);
        local_38 = plVar9[0xd];
        load_type<std::__cxx11::string>
                  ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,(detail *)&local_38,
                   handle_00);
        local_80 = &local_70;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == &local_188.field_2) {
          local_70.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
        }
        else {
          local_80 = (PyObject *)local_188._M_dataplus._M_p;
        }
        local_70.ob_refcnt = local_188.field_2._M_allocated_capacity;
        local_78 = local_188._M_string_length;
        plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x11652a);
        plVar13 = plVar10 + 2;
        if ((long *)*plVar10 == plVar13) {
          local_50 = *plVar13;
          lStack_48 = plVar10[3];
          local_60 = &local_50;
        }
        else {
          local_50 = *plVar13;
          local_60 = (long *)*plVar10;
        }
        local_58 = plVar10[1];
        *plVar10 = (long)plVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_60);
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_118 = *puVar14;
          lStack_110 = plVar10[3];
          local_128 = &local_118;
        }
        else {
          local_118 = *puVar14;
          local_128 = (ulong *)*plVar10;
        }
        local_120 = plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        __val = -uVar5;
        if (0 < (int)uVar5) {
          __val = uVar5;
        }
        __len = 1;
        if (9 < __val) {
          uVar15 = (ulong)__val;
          uVar4 = 4;
          do {
            __len = uVar4;
            uVar6 = (uint)uVar15;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_00109f87;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_00109f87;
            }
            if (uVar6 < 10000) goto LAB_00109f87;
            uVar15 = uVar15 / 10000;
            uVar4 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_00109f87:
        local_e8 = local_d8;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_e8,(char)__len - (char)((int)uVar5 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)((ulong)(uVar5 >> 0x1f) + (long)local_e8),__len,__val);
        in_RDI = local_88;
        uVar15 = 0xf;
        if (local_128 != &local_118) {
          uVar15 = local_118;
        }
        if (uVar15 < (ulong)(local_e0 + local_120)) {
          uVar15 = 0xf;
          if (local_e8 != local_d8) {
            uVar15 = local_d8[0];
          }
          if (uVar15 < (ulong)(local_e0 + local_120)) goto LAB_0010a030;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_128);
        }
        else {
LAB_0010a030:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_e8);
        }
        local_148 = &local_138;
        plVar10 = puVar11 + 2;
        if ((long *)*puVar11 == plVar10) {
          local_138 = *plVar10;
          uStack_130 = puVar11[3];
        }
        else {
          local_138 = *plVar10;
          local_148 = (long *)*puVar11;
        }
        local_140 = puVar11[1];
        *puVar11 = plVar10;
        puVar11[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
        local_108 = &local_f8;
        puVar14 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar14) {
          local_f8 = *puVar14;
          lStack_f0 = plVar10[3];
        }
        else {
          local_f8 = *puVar14;
          local_108 = (ulong *)*plVar10;
        }
        local_100 = (handle *)plVar10[1];
        *plVar10 = (long)puVar14;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        local_40 = plVar9[0xe];
        load_type<std::__cxx11::string>
                  ((make_caster<std::__cxx11::basic_string<char>_> *)&local_188,(detail *)&local_40,
                   local_100);
        local_c8 = (PyObject *)local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == &local_188.field_2) {
          local_b8.ob_type = (PyTypeObject *)local_188.field_2._8_8_;
          local_c8 = &local_b8;
        }
        local_b8.ob_refcnt = local_188.field_2._M_allocated_capacity;
        local_c0 = local_188._M_string_length;
        uVar15 = 0xf;
        if (local_108 != &local_f8) {
          uVar15 = local_f8;
        }
        uVar2 = (long)&local_100->m_ptr + local_188._M_string_length;
        if (uVar15 < uVar2) {
          uVar17 = 0xf;
          if (local_c8 != &local_b8) {
            uVar17 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < uVar2) goto LAB_0010a1ba;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_108);
        }
        else {
LAB_0010a1ba:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_c8);
        }
        local_168._0_8_ = &local_168.key;
        pppcVar1 = (key_type **)(puVar11 + 2);
        if ((key_type **)*puVar11 == pppcVar1) {
          local_168.key = (key_type)*pppcVar1;
          local_168.cache.super_handle.m_ptr = (handle)puVar11[3];
        }
        else {
          local_168.key = (key_type)*pppcVar1;
          local_168._0_8_ = (key_type **)*puVar11;
        }
        local_168.obj.m_ptr = (PyObject *)puVar11[1];
        *puVar11 = pppcVar1;
        puVar11[1] = 0;
        *(undefined1 *)pppcVar1 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_168);
        local_1a8.m_ptr = &local_198;
        pPVar16 = (PyObject *)(plVar10 + 2);
        if ((PyObject *)*plVar10 == pPVar16) {
          local_198.ob_refcnt = pPVar16->ob_refcnt;
          local_198.ob_type = (PyTypeObject *)plVar10[3];
        }
        else {
          local_198.ob_refcnt = pPVar16->ob_refcnt;
          local_1a8.m_ptr = (PyObject *)*plVar10;
        }
        local_1a0 = plVar10[1];
        *plVar10 = (long)pPVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)in_RDI,(ulong)local_1a8.m_ptr);
        if (local_1a8.m_ptr != &local_198) {
          operator_delete(local_1a8.m_ptr,local_198.ob_refcnt + 1);
        }
        if ((key_type *)local_168._0_8_ != &local_168.key) {
          operator_delete((void *)local_168._0_8_,(long)local_168.key + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8.ob_refcnt + 1);
        }
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138 + 1);
        }
        if (local_e8 != local_d8) {
          operator_delete(local_e8,local_d8[0] + 1);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,local_50 + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70.ob_refcnt + 1);
        }
        *plVar9 = *plVar9 + -1;
        if (*plVar9 == 0) {
          _Py_Dealloc(plVar9);
        }
        pPVar12 = (PyTypeObject *)PyFrame_GetBack(pPVar3);
        (pPVar3->ob_base).ob_base.ob_refcnt = (pPVar3->ob_base).ob_base.ob_refcnt + -1;
        if ((pPVar3->ob_base).ob_base.ob_refcnt == 0) {
          _Py_Dealloc(pPVar3);
        }
      }
    }
    error_scope::~error_scope(&local_a8);
  }
  return in_RDI;
}

Assistant:

PYBIND11_NOINLINE std::string error_string() {
    if (!PyErr_Occurred()) {
        PyErr_SetString(PyExc_RuntimeError, "Unknown internal error occurred");
        return "Unknown internal error occurred";
    }

    error_scope scope; // Preserve error state

    std::string errorString;
    if (scope.type) {
        errorString += handle(scope.type).attr("__name__").cast<std::string>();
        errorString += ": ";
    }
    if (scope.value) {
        errorString += (std::string) str(scope.value);
    }

    PyErr_NormalizeException(&scope.type, &scope.value, &scope.trace);

#if PY_MAJOR_VERSION >= 3
    if (scope.trace != nullptr) {
        PyException_SetTraceback(scope.value, scope.trace);
    }
#endif

#if !defined(PYPY_VERSION)
    if (scope.trace) {
        auto *trace = (PyTracebackObject *) scope.trace;

        /* Get the deepest trace possible */
        while (trace->tb_next) {
            trace = trace->tb_next;
        }

        PyFrameObject *frame = trace->tb_frame;
        Py_XINCREF(frame);
        errorString += "\n\nAt:\n";
        while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
            PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
            PyCodeObject *f_code = frame->f_code;
            Py_INCREF(f_code);
#    endif
            int lineno = PyFrame_GetLineNumber(frame);
            errorString += "  " + handle(f_code->co_filename).cast<std::string>() + "("
                           + std::to_string(lineno)
                           + "): " + handle(f_code->co_name).cast<std::string>() + "\n";
            Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
            auto *b_frame = PyFrame_GetBack(frame);
#    else
            auto *b_frame = frame->f_back;
            Py_XINCREF(b_frame);
#    endif
            Py_DECREF(frame);
            frame = b_frame;
        }
    }
#endif

    return errorString;
}